

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O1

double __thiscall
ChebTools::ChebyshevExpansion::y_Clenshaw_xscaled(ChebyshevExpansion *this,double xscaled)

{
  long lVar1;
  double *pdVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  lVar1 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  if (lVar1 < 1) {
    __assert_fail("index >= 0 && index < size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                  ,0xa3,
                  "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                 );
  }
  uVar3 = (int)lVar1 - 1;
  pdVar2 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  dVar6 = pdVar2[lVar1 + -1];
  dVar7 = 0.0;
  if (1 < (int)uVar3) {
    uVar4 = (ulong)(uVar3 & 0x7fffffff);
    lVar5 = uVar4 + 1;
    dVar8 = 0.0;
    do {
      dVar7 = dVar6;
      if (lVar1 < (long)uVar4) {
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0xb5,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                     );
      }
      dVar6 = ((xscaled + xscaled) * dVar7 - dVar8) + pdVar2[lVar5 + -2];
      lVar5 = lVar5 + -1;
      dVar8 = dVar7;
    } while (2 < lVar5);
  }
  return (xscaled * dVar6 + *pdVar2) - dVar7;
}

Assistant:

double ChebyshevExpansion::y_Clenshaw_xscaled(const double xscaled) const {
        // See https://en.wikipedia.org/wiki/Clenshaw_algorithm#Special_case_for_Chebyshev_series
        std::size_t Norder = m_c.size() - 1;
        double u_k = 0, u_kp1 = m_c[Norder], u_kp2 = 0;
        int k = 0;
        for (k = static_cast<int>(Norder) - 1; k >= 1; --k) {
            // Do the recurrent calculation
            u_k = 2.0 * xscaled * u_kp1 - u_kp2 + m_c(k);
            // Update the values
            u_kp2 = u_kp1; u_kp1 = u_k;
        }
        return m_c(0) + xscaled * u_kp1 - u_kp2;
    }